

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall Math_ErfInv_Test::TestBody(Math_ErfInv_Test *this)

{
  bool bVar1;
  int __x;
  undefined1 *in_RDI;
  float fVar2;
  Float FVar3;
  double dVar4;
  AssertionResult gtest_ar_1;
  Float err;
  AssertionResult gtest_ar;
  Float ei;
  Float e;
  float x;
  float *__end1;
  float *__begin1;
  float (*__range1) [6];
  float xvl [6];
  char (*in_stack_fffffffffffffee8) [6];
  AssertHelper *in_stack_fffffffffffffef0;
  Message *in_stack_fffffffffffffef8;
  Message *in_stack_ffffffffffffff00;
  Message *in_stack_ffffffffffffff08;
  Message *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff18;
  AssertionResult *in_stack_ffffffffffffff20;
  undefined1 local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  double *in_stack_ffffffffffffffa0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar5;
  float *local_38;
  float local_28 [10];
  
  local_28[0] = 0.0;
  local_28[1] = 0.1125;
  local_28[2] = 0.25;
  local_28[3] = 0.753;
  local_28[4] = 1.521;
  local_28[5] = 2.5115;
  for (local_38 = local_28; local_38 != local_28 + 6; local_38 = local_38 + 1) {
    fVar5 = *local_38;
    dVar4 = std::erf((double)(ulong)(uint)fVar5);
    __x = (int)in_RDI;
    fVar2 = SUB84(dVar4,0);
    if (fVar2 < 1.0) {
      FVar3 = pbrt::ErfInv((Float)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        in_stack_ffffffffffffff74 = FVar3 - fVar5;
        std::abs(__x);
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 / fVar5;
        in_stack_ffffffffffffff20 = (AssertionResult *)local_a0;
        testing::internal::CmpHelperLT<float,double>
                  ((char *)CONCAT44(fVar5,fVar2),(char *)CONCAT44(FVar3,in_stack_ffffffffffffffb0),
                   (float *)in_stack_ffffffffffffffa8.ptr_,in_stack_ffffffffffffffa0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_ffffffffffffff20);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff20);
          in_stack_ffffffffffffff18 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
          in_stack_ffffffffffffff10 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          in_stack_ffffffffffffff08 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
          in_stack_ffffffffffffff00 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          in_stack_fffffffffffffef8 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
          in_stack_fffffffffffffef0 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x5eadbd);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_ffffffffffffff20,
                     (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (char *)in_stack_ffffffffffffff10,
                     (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (char *)in_stack_ffffffffffffff00);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (Message *)in_stack_ffffffffffffff68.ptr_);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffef0);
          testing::Message::~Message((Message *)0x5eae0b);
        }
        in_RDI = local_a0;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5eae57);
      }
      else {
        testing::internal::EqHelper<true>::Compare<int,float>
                  ((char *)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                   (int *)in_stack_fffffffffffffef8,(float *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffffa0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff20);
          testing::AssertionResult::failure_message((AssertionResult *)0x5eabc1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_ffffffffffffff20,
                     (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (char *)in_stack_ffffffffffffff10,
                     (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (char *)in_stack_ffffffffffffff00);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (Message *)in_stack_ffffffffffffff68.ptr_);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffef0);
          testing::Message::~Message((Message *)0x5eac1e);
        }
        in_RDI = &stack0xffffffffffffffa0;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5eac73);
      }
    }
  }
  return;
}

Assistant:

TEST(Math, ErfInv) {
    float xvl[] = {0., 0.1125, 0.25, .753, 1.521, 2.5115};
    for (float x : xvl) {
        Float e = std::erf(x);
        if (e < 1) {
            Float ei = ErfInv(e);
            if (x == 0)
                EXPECT_EQ(0, ei);
            else {
                Float err = std::abs(ei - x) / x;
                EXPECT_LT(err, 1e-4) << x << " erf " << e << " inv " << ei;
            }
        }
    }
}